

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O1

uint32_t * FastPForLib::__fastpackwithoutmask25_8(uint32_t *in,uint32_t *out)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = *in;
  *out = uVar1;
  uVar2 = in[1];
  *out = uVar2 << 0x19 | uVar1;
  uVar2 = uVar2 >> 7;
  out[1] = uVar2;
  uVar1 = in[2];
  out[1] = uVar1 << 0x12 | uVar2;
  uVar1 = uVar1 >> 0xe;
  out[2] = uVar1;
  uVar2 = in[3];
  out[2] = uVar2 << 0xb | uVar1;
  uVar2 = uVar2 >> 0x15;
  out[3] = uVar2;
  uVar2 = in[4] << 4 | uVar2;
  out[3] = uVar2;
  uVar1 = in[5];
  out[3] = uVar1 << 0x1d | uVar2;
  uVar1 = uVar1 >> 3;
  out[4] = uVar1;
  uVar2 = in[6];
  out[4] = uVar2 << 0x16 | uVar1;
  uVar2 = uVar2 >> 10;
  out[5] = uVar2;
  uVar1 = in[7];
  out[5] = uVar1 << 0xf | uVar2;
  out[6] = uVar1 >> 0x11;
  return out + 7;
}

Assistant:

uint32_t *__fastpackwithoutmask25_8(const uint32_t *__restrict__ in,
                                    uint32_t *__restrict__ out) {

  *out = (*in);
  ++in;
  *out |= ((*in)) << 25;
  ++out;
  *out = ((*in)) >> (25 - 18);
  ++in;
  *out |= ((*in)) << 18;
  ++out;
  *out = ((*in)) >> (25 - 11);
  ++in;
  *out |= ((*in)) << 11;
  ++out;
  *out = ((*in)) >> (25 - 4);
  ++in;
  *out |= ((*in)) << 4;
  ++in;
  *out |= ((*in)) << 29;
  ++out;
  *out = ((*in)) >> (25 - 22);
  ++in;
  *out |= ((*in)) << 22;
  ++out;
  *out = ((*in)) >> (25 - 15);
  ++in;
  *out |= ((*in)) << 15;
  ++out;
  *out = ((*in)) >> (25 - 8);
  ++in;

  return out + 1;
}